

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O2

Status __thiscall leveldb::log::Writer::AddRecord(Writer *this,Slice *slice)

{
  undefined8 uVar1;
  uint uVar2;
  size_t *in_RDX;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  size_t length;
  undefined1 local_50 [24];
  Status local_38;
  
  length = *in_RDX;
  uVar3 = in_RDX[1];
  bVar6 = true;
  local_50._16_8_ = this;
  do {
    uVar2 = (uint)slice->size_;
    if (0x7ff9 < (int)uVar2) {
      if (uVar2 < 0x8000) {
        local_50._8_8_ = ZEXT48(0x8000 - uVar2);
        local_50._0_8_ = "";
        (**(code **)(*(long *)slice->data_ + 0x10))(&local_38,slice->data_,local_50);
        Status::~Status(&local_38);
      }
      *(undefined4 *)&slice->size_ = 0;
      uVar2 = 0;
    }
    uVar4 = (ulong)(int)(0x7ff9 - uVar2);
    uVar5 = uVar4;
    if (uVar3 < uVar4) {
      uVar5 = uVar3;
    }
    uVar2 = (uVar4 < uVar3) + 1;
    if (!bVar6) {
      uVar2 = 4 - (uVar4 < uVar3);
    }
    EmitPhysicalRecord((Writer *)local_50,(RecordType)slice,(char *)(ulong)uVar2,length);
    uVar1 = local_50._0_8_;
    local_50._0_8_ = (WritableFile *)0x0;
    Status::~Status((Status *)local_50);
    if ((WritableFile *)uVar1 != (WritableFile *)0x0) break;
    length = length + uVar5;
    bVar6 = false;
    uVar3 = uVar3 - uVar5;
  } while (uVar3 != 0);
  *(WritableFile **)local_50._16_8_ = (WritableFile *)uVar1;
  return (Status)(char *)local_50._16_8_;
}

Assistant:

Status Writer::AddRecord(const Slice& slice) {
  const char* ptr = slice.data();
  size_t left = slice.size();

  // Fragment the record if necessary and emit it.  Note that if slice
  // is empty, we still want to iterate once to emit a single
  // zero-length record
  Status s;
  bool begin = true;
  do {
    const int leftover = kBlockSize - block_offset_;
    assert(leftover >= 0);
    if (leftover < kHeaderSize) {
      // Switch to a new block
      if (leftover > 0) {
        // Fill the trailer (literal below relies on kHeaderSize being 7)
        static_assert(kHeaderSize == 7, "");
        dest_->Append(Slice("\x00\x00\x00\x00\x00\x00", leftover));
      }
      block_offset_ = 0;
    }

    // Invariant: we never leave < kHeaderSize bytes in a block.
    assert(kBlockSize - block_offset_ - kHeaderSize >= 0);

    const size_t avail = kBlockSize - block_offset_ - kHeaderSize;
    const size_t fragment_length = (left < avail) ? left : avail;

    RecordType type;
    const bool end = (left == fragment_length);
    if (begin && end) {
      type = kFullType;
    } else if (begin) {
      type = kFirstType;
    } else if (end) {
      type = kLastType;
    } else {
      type = kMiddleType;
    }

    s = EmitPhysicalRecord(type, ptr, fragment_length);
    ptr += fragment_length;
    left -= fragment_length;
    begin = false;
  } while (s.ok() && left > 0);
  return s;
}